

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bigint * __thiscall fmt::v10::detail::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  uint *puVar5;
  bigit c;
  size_t n;
  size_t i;
  bigit carry;
  int shift_local;
  bigint *this_local;
  
  _carry = this;
  if (shift < 0) {
    i._4_4_ = shift;
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/format.h"
                ,0xb4f,"");
  }
  this->exp_ = shift / 0x20 + this->exp_;
  i._4_4_ = shift % 0x20;
  if (i._4_4_ != 0) {
    i._0_4_ = 0;
    n = 0;
    sVar4 = buffer<unsigned_int>::size((buffer<unsigned_int> *)this);
    for (; n < sVar4; n = n + 1) {
      puVar5 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)this,n);
      uVar1 = *puVar5;
      cVar2 = (char)i._4_4_;
      puVar5 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)this,n);
      uVar3 = (*puVar5 << ((byte)i._4_4_ & 0x1f)) + (uint)i;
      puVar5 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)this,n);
      *puVar5 = uVar3;
      i._0_4_ = uVar1 >> (0x20U - cVar2 & 0x1f);
    }
    if ((uint)i != 0) {
      buffer<unsigned_int>::push_back((buffer<unsigned_int> *)this,(uint *)&i);
    }
  }
  return this;
}

Assistant:

auto operator<<=(int shift) -> bigint& {
    FMT_ASSERT(shift >= 0, "");
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }